

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  cmMakefile *pcVar1;
  char *prop_00;
  bool bVar2;
  TargetType tgtType;
  cmMessenger *messenger;
  ostream *poVar3;
  cmTargetInternals *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  undefined1 local_728 [8];
  cmListFileBacktrace lfbt_7;
  cmListFileBacktrace lfbt_6;
  cmListFileBacktrace lfbt_5;
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  cmListFileBacktrace lfbt_2;
  cmListFileBacktrace lfbt_1;
  cmListFileBacktrace lfbt;
  ostringstream local_688 [8];
  ostringstream e_3;
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream e_2;
  string local_378;
  ostringstream local_358 [8];
  ostringstream e_1;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream e;
  undefined1 local_38 [31];
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_38[0x17] = asString;
  unique0x100010b3 = (_Elt_pointer)value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  tgtType = GetType(this);
  prop_00 = value_local;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace((cmMakefile *)local_38);
  bVar2 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,(string *)prop_00,messenger,(cmListFileBacktrace *)local_38);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_38);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"NAME");
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      std::operator<<((ostream *)local_1c0,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"EXPORT_NAME");
      if ((bVar2) && (bVar2 = IsImported(this), bVar2)) {
        std::__cxx11::ostringstream::ostringstream(local_358);
        poVar3 = std::operator<<((ostream *)local_358,
                                 "EXPORT_NAME property can\'t be set on imported targets (\"");
        poVar3 = std::operator<<(poVar3,(string *)&this->Name);
        std::operator<<(poVar3,"\")\n");
        pcVar1 = this->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::ostringstream::~ostringstream(local_358);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,"SOURCES");
        if ((bVar2) && (bVar2 = IsImported(this), bVar2)) {
          std::__cxx11::ostringstream::ostringstream(local_4f0);
          poVar3 = std::operator<<((ostream *)local_4f0,
                                   "SOURCES property can\'t be set on imported targets (\"");
          poVar3 = std::operator<<(poVar3,(string *)&this->Name);
          std::operator<<(poVar3,"\")\n");
          pcVar1 = this->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_510);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::ostringstream::~ostringstream(local_4f0);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,"IMPORTED_GLOBAL");
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_688);
            poVar3 = std::operator<<((ostream *)local_688,
                                     "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\""
                                    );
            poVar3 = std::operator<<(poVar3,(string *)&this->Name);
            std::operator<<(poVar3,"\")\n");
            pcVar1 = this->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage
                      (pcVar1,FATAL_ERROR,
                       (string *)
                       &lfbt.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::string::~string
                      ((string *)
                       &lfbt.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::ostringstream::~ostringstream(local_688);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value_local,"INCLUDE_DIRECTORIES");
            if (bVar2) {
              if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                 (*(char *)&(stack0xffffffffffffffe0->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pcVar4,(char **)(local_38 + 0x18));
                cmMakefile::GetBacktrace
                          ((cmMakefile *)
                           &lfbt_1.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&pcVar4->IncludeDirectoriesBacktraces,
                           (value_type *)
                           &lfbt_1.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                cmListFileBacktrace::~cmListFileBacktrace
                          ((cmListFileBacktrace *)
                           &lfbt_1.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value_local,"COMPILE_OPTIONS");
              if (bVar2) {
                if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                   (*(char *)&(stack0xffffffffffffffe0->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                  pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pcVar4->CompileOptionsEntries,(char **)(local_38 + 0x18));
                  cmMakefile::GetBacktrace
                            ((cmMakefile *)
                             &lfbt_2.TopEntry.
                              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&pcVar4->CompileOptionsBacktraces,
                             (value_type *)
                             &lfbt_2.TopEntry.
                              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  cmListFileBacktrace::~cmListFileBacktrace
                            ((cmListFileBacktrace *)
                             &lfbt_2.TopEntry.
                              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value_local,"COMPILE_FEATURES");
                if (bVar2) {
                  if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                     (*(char *)&(stack0xffffffffffffffe0->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                    pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pcVar4->CompileFeaturesEntries,(char **)(local_38 + 0x18));
                    cmMakefile::GetBacktrace
                              ((cmMakefile *)
                               &lfbt_3.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar4->CompileFeaturesBacktraces,
                              (value_type *)
                              &lfbt_3.TopEntry.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
                    cmListFileBacktrace::~cmListFileBacktrace
                              ((cmListFileBacktrace *)
                               &lfbt_3.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value_local,"COMPILE_DEFINITIONS");
                  if (bVar2) {
                    if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                       (*(char *)&(stack0xffffffffffffffe0->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                      pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar4->CompileDefinitionsEntries,(char **)(local_38 + 0x18));
                      cmMakefile::GetBacktrace
                                ((cmMakefile *)
                                 &lfbt_4.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar4->CompileDefinitionsBacktraces,
                                (value_type *)
                                &lfbt_4.TopEntry.
                                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
                      cmListFileBacktrace::~cmListFileBacktrace
                                ((cmListFileBacktrace *)
                                 &lfbt_4.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)value_local,"LINK_OPTIONS");
                    if (bVar2) {
                      if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                         (*(char *)&(stack0xffffffffffffffe0->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                        pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&pcVar4->LinkOptionsEntries,(char **)(local_38 + 0x18));
                        cmMakefile::GetBacktrace
                                  ((cmMakefile *)
                                   &lfbt_5.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&pcVar4->LinkOptionsBacktraces,
                                  (value_type *)
                                  &lfbt_5.TopEntry.
                                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
                        cmListFileBacktrace::~cmListFileBacktrace
                                  ((cmListFileBacktrace *)
                                   &lfbt_5.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      }
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value_local,"LINK_DIRECTORIES");
                      if (bVar2) {
                        if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                           (*(char *)&(stack0xffffffffffffffe0->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                          pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<char_const*&>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&pcVar4->LinkDirectoriesEntries,(char **)(local_38 + 0x18));
                          cmMakefile::GetBacktrace
                                    ((cmMakefile *)
                                     &lfbt_6.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          push_back(&pcVar4->LinkDirectoriesBacktraces,
                                    (value_type *)
                                    &lfbt_6.TopEntry.
                                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
                          cmListFileBacktrace::~cmListFileBacktrace
                                    ((cmListFileBacktrace *)
                                     &lfbt_6.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)value_local,"LINK_LIBRARIES");
                        if (bVar2) {
                          if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                             (*(char *)&(stack0xffffffffffffffe0->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                            cmMakefile::GetBacktrace
                                      ((cmMakefile *)
                                       &lfbt_7.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&pcVar4->LinkImplementationPropertyEntries,
                                       (char **)(local_38 + 0x18));
                            pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&pcVar4->LinkImplementationPropertyBacktraces,
                                      (value_type *)
                                      &lfbt_7.TopEntry.
                                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)
                                       &lfbt_7.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,"SOURCES");
                          if (bVar2) {
                            cmMakefile::GetBacktrace((cmMakefile *)local_728);
                            pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&pcVar4->SourceEntries,(char **)(local_38 + 0x18));
                            pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&pcVar4->SourceBacktraces,(value_type *)local_728);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)local_728);
                          }
                          else {
                            bVar2 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)value_local,(char (*) [17])"IMPORTED_LIBNAME");
                            if (bVar2) {
                              pcVar1 = this->Makefile;
                              std::operator+(&local_748,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)value_local," property may not be APPENDed.");
                              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_748);
                              std::__cxx11::string::~string((string *)&local_748);
                            }
                            else {
                              cmPropertyMap::AppendProperty
                                        (&this->Properties,(string *)value_local,
                                         (char *)stack0xffffffffffffffe0,(bool)(local_38[0x17] & 1))
                              ;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (value && *value) {
      this->Internal->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (value && *value) {
      this->Internal->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (value && *value) {
      this->Internal->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (value && *value) {
      this->Internal->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (value && *value) {
      this->Internal->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (value && *value) {
      this->Internal->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (value && *value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.emplace_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.emplace_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 prop + " property may not be APPENDed.");
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}